

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::InstanceArrayIntersectorKMB<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  size_t sVar4;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar6;
  undefined1 auVar7 [16];
  AABBNodeMB4D *node1;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  size_t sVar11;
  Primitive_conflict4 *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar12;
  NodeRef *pNVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 in_ZMM0 [64];
  undefined1 auVar20 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  float fVar24;
  float fVar25;
  float fVar28;
  float fVar30;
  float fVar32;
  undefined1 auVar26 [16];
  float fVar29;
  float fVar31;
  float fVar33;
  undefined1 auVar27 [16];
  float fVar34;
  float fVar38;
  float fVar39;
  vint4 ai_2;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar40;
  undefined1 auVar37 [16];
  vint4 ai_1;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 ai_3;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 bi;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 bi_1;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 bi_3;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 ai;
  undefined1 auVar58 [16];
  undefined1 in_ZMM9 [64];
  vint4 bi_2;
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  Precalculations pre;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_17c8;
  undefined1 local_17a8 [16];
  vbool<4> valid0;
  InstanceArrayIntersectorKMB<4> local_16e8 [16];
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    auVar7 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar26 = vpcmpeqd_avx(auVar7,(undefined1  [16])valid_i->field_0);
    auVar20 = ZEXT816(0) << 0x40;
    auVar7 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar20,5);
    auVar22 = auVar26 & auVar7;
    if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar22[0xf] < '\0')
    {
      auVar27 = vpcmpeqd_avx(in_ZMM9._0_16_,in_ZMM9._0_16_);
      auVar7 = vandps_avx(auVar7,auVar26);
      auVar60 = ZEXT1664(*(undefined1 (*) [16])ray);
      auVar61 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
      auVar35._8_4_ = 0x7fffffff;
      auVar35._0_8_ = 0x7fffffff7fffffff;
      auVar35._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar35);
      auVar45._8_4_ = 0x219392ef;
      auVar45._0_8_ = 0x219392ef219392ef;
      auVar45._12_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar26,auVar45,1);
      auVar22 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar45,auVar26);
      auVar26 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar35);
      auVar26 = vcmpps_avx(auVar26,auVar45,1);
      auVar62 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar45,auVar26);
      auVar26 = vrcpps_avx(auVar22);
      fVar24 = auVar26._0_4_;
      auVar41._0_4_ = auVar22._0_4_ * fVar24;
      fVar28 = auVar26._4_4_;
      auVar41._4_4_ = auVar22._4_4_ * fVar28;
      fVar30 = auVar26._8_4_;
      auVar41._8_4_ = auVar22._8_4_ * fVar30;
      fVar32 = auVar26._12_4_;
      auVar41._12_4_ = auVar22._12_4_ * fVar32;
      auVar55._8_4_ = 0x3f800000;
      auVar55._0_8_ = &DAT_3f8000003f800000;
      auVar55._12_4_ = 0x3f800000;
      auVar41 = vsubps_avx(auVar55,auVar41);
      auVar26 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar35);
      auVar26 = vcmpps_avx(auVar26,auVar45,1);
      auVar26 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar45,auVar26);
      auVar22 = vrcpps_avx(auVar62);
      fVar16 = auVar22._0_4_;
      auVar49._0_4_ = auVar62._0_4_ * fVar16;
      fVar17 = auVar22._4_4_;
      auVar49._4_4_ = auVar62._4_4_ * fVar17;
      fVar18 = auVar22._8_4_;
      auVar49._8_4_ = auVar62._8_4_ * fVar18;
      fVar19 = auVar22._12_4_;
      auVar49._12_4_ = auVar62._12_4_ * fVar19;
      auVar62 = vsubps_avx(auVar55,auVar49);
      auVar22 = vrcpps_avx(auVar26);
      fVar34 = auVar22._0_4_;
      auVar36._0_4_ = auVar26._0_4_ * fVar34;
      fVar38 = auVar22._4_4_;
      auVar36._4_4_ = auVar26._4_4_ * fVar38;
      fVar39 = auVar22._8_4_;
      auVar36._8_4_ = auVar26._8_4_ * fVar39;
      fVar40 = auVar22._12_4_;
      auVar36._12_4_ = auVar26._12_4_ * fVar40;
      auVar26 = vsubps_avx(auVar55,auVar36);
      auVar63 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
      fVar34 = fVar34 + fVar34 * auVar26._0_4_;
      fVar38 = fVar38 + fVar38 * auVar26._4_4_;
      fVar39 = fVar39 + fVar39 * auVar26._8_4_;
      fVar40 = fVar40 + fVar40 * auVar26._12_4_;
      auVar26 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar20);
      auVar22 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      aVar6.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar26,auVar7);
      fVar24 = fVar24 + fVar24 * auVar41._0_4_;
      fVar28 = fVar28 + fVar28 * auVar41._4_4_;
      fVar30 = fVar30 + fVar30 * auVar41._8_4_;
      fVar32 = fVar32 + fVar32 * auVar41._12_4_;
      auVar26._8_4_ = 0xff800000;
      auVar26._0_8_ = 0xff800000ff800000;
      auVar26._12_4_ = 0xff800000;
      auVar26 = vblendvps_avx(auVar26,auVar22,auVar7);
      auVar59 = ZEXT1664(auVar26);
      fVar16 = fVar16 + fVar16 * auVar62._0_4_;
      fVar17 = fVar17 + fVar17 * auVar62._4_4_;
      fVar18 = fVar18 + fVar18 * auVar62._8_4_;
      fVar19 = fVar19 + fVar19 * auVar62._12_4_;
      local_17a8._0_4_ = auVar7._0_4_ ^ auVar27._0_4_;
      local_17a8._4_4_ = auVar7._4_4_ ^ auVar27._4_4_;
      local_17a8._8_4_ = auVar7._8_4_ ^ auVar27._8_4_;
      local_17a8._12_4_ = auVar7._12_4_ ^ auVar27._12_4_;
      pNVar13 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar12 = &stack_near[2].field_0;
      stack_near[1].field_0 = aVar6;
LAB_00336735:
      paVar12 = paVar12 + -1;
      sVar11 = pNVar13[-1].ptr;
      pNVar13 = pNVar13 + -1;
      bVar15 = true;
      if (sVar11 != 0xfffffffffffffff8) {
        local_17c8 = *paVar12;
        auVar22 = auVar59._0_16_;
        auVar26 = vcmpps_avx((undefined1  [16])local_17c8,auVar22,1);
        auVar23 = ZEXT1664(auVar26);
        if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar26[0xf] < '\0') {
          do {
            uVar10 = (uint)sVar11;
            auVar26 = auVar60._0_16_;
            auVar20 = auVar61._0_16_;
            auVar62 = auVar63._0_16_;
            if ((sVar11 & 8) != 0) {
              if (sVar11 == 0xfffffffffffffff8) goto LAB_00336976;
              auVar27 = vcmpps_avx(auVar22,(undefined1  [16])local_17c8,6);
              if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar27[0xf] < '\0') {
                uVar9 = (ulong)(uVar10 & 0xf);
                valid0.field_0._0_8_ = local_17a8._0_8_ ^ 0xffffffffffffffff;
                valid0.field_0.i[2] = local_17a8._8_4_ ^ 0xffffffff;
                valid0.field_0.i[3] = local_17a8._12_4_ ^ 0xffffffff;
                aVar21 = auVar23._0_16_;
                aVar5 = valid0.field_0;
                if (uVar9 == 8) goto LAB_00336a3a;
                prim = (Primitive_conflict4 *)(sVar11 & 0xfffffffffffffff0);
                uVar8 = 1;
                goto LAB_003369e6;
              }
              break;
            }
            uVar8 = sVar11 & 0xfffffffffffffff0;
            auVar23 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            uVar9 = 0;
            sVar11 = 8;
            do {
              sVar4 = *(size_t *)(uVar8 + uVar9 * 8);
              if (sVar4 != 8) {
                fVar1 = *(float *)(uVar8 + 0x80 + uVar9 * 4);
                fVar2 = *(float *)(uVar8 + 0x20 + uVar9 * 4);
                auVar27 = *(undefined1 (*) [16])(ray + 0x70);
                fVar25 = auVar27._0_4_;
                fVar29 = auVar27._4_4_;
                fVar31 = auVar27._8_4_;
                fVar33 = auVar27._12_4_;
                auVar37._0_4_ = fVar25 * fVar1 + fVar2;
                auVar37._4_4_ = fVar29 * fVar1 + fVar2;
                auVar37._8_4_ = fVar31 * fVar1 + fVar2;
                auVar37._12_4_ = fVar33 * fVar1 + fVar2;
                fVar1 = *(float *)(uVar8 + 0xa0 + uVar9 * 4);
                fVar2 = *(float *)(uVar8 + 0x40 + uVar9 * 4);
                auVar42._0_4_ = fVar25 * fVar1 + fVar2;
                auVar42._4_4_ = fVar29 * fVar1 + fVar2;
                auVar42._8_4_ = fVar31 * fVar1 + fVar2;
                auVar42._12_4_ = fVar33 * fVar1 + fVar2;
                fVar1 = *(float *)(uVar8 + 0xc0 + uVar9 * 4);
                fVar2 = *(float *)(uVar8 + 0x60 + uVar9 * 4);
                auVar46._0_4_ = fVar25 * fVar1 + fVar2;
                auVar46._4_4_ = fVar29 * fVar1 + fVar2;
                auVar46._8_4_ = fVar31 * fVar1 + fVar2;
                auVar46._12_4_ = fVar33 * fVar1 + fVar2;
                fVar1 = *(float *)(uVar8 + 0x90 + uVar9 * 4);
                fVar2 = *(float *)(uVar8 + 0x30 + uVar9 * 4);
                auVar50._0_4_ = fVar25 * fVar1 + fVar2;
                auVar50._4_4_ = fVar29 * fVar1 + fVar2;
                auVar50._8_4_ = fVar31 * fVar1 + fVar2;
                auVar50._12_4_ = fVar33 * fVar1 + fVar2;
                fVar1 = *(float *)(uVar8 + 0xb0 + uVar9 * 4);
                fVar2 = *(float *)(uVar8 + 0x50 + uVar9 * 4);
                auVar53._0_4_ = fVar2 + fVar25 * fVar1;
                auVar53._4_4_ = fVar2 + fVar29 * fVar1;
                auVar53._8_4_ = fVar2 + fVar31 * fVar1;
                auVar53._12_4_ = fVar2 + fVar33 * fVar1;
                fVar1 = *(float *)(uVar8 + 0xd0 + uVar9 * 4);
                fVar2 = *(float *)(uVar8 + 0x70 + uVar9 * 4);
                auVar56._0_4_ = fVar1 * fVar25 + fVar2;
                auVar56._4_4_ = fVar1 * fVar29 + fVar2;
                auVar56._8_4_ = fVar1 * fVar31 + fVar2;
                auVar56._12_4_ = fVar1 * fVar33 + fVar2;
                auVar41 = vsubps_avx(auVar37,auVar26);
                auVar58._0_4_ = fVar24 * auVar41._0_4_;
                auVar58._4_4_ = fVar28 * auVar41._4_4_;
                auVar58._8_4_ = fVar30 * auVar41._8_4_;
                auVar58._12_4_ = fVar32 * auVar41._12_4_;
                auVar41 = vsubps_avx(auVar42,auVar20);
                auVar43._0_4_ = fVar34 * auVar41._0_4_;
                auVar43._4_4_ = fVar38 * auVar41._4_4_;
                auVar43._8_4_ = fVar39 * auVar41._8_4_;
                auVar43._12_4_ = fVar40 * auVar41._12_4_;
                auVar41 = vsubps_avx(auVar46,auVar62);
                auVar47._0_4_ = fVar16 * auVar41._0_4_;
                auVar47._4_4_ = fVar17 * auVar41._4_4_;
                auVar47._8_4_ = fVar18 * auVar41._8_4_;
                auVar47._12_4_ = fVar19 * auVar41._12_4_;
                auVar41 = vsubps_avx(auVar50,auVar26);
                auVar51._0_4_ = fVar24 * auVar41._0_4_;
                auVar51._4_4_ = fVar28 * auVar41._4_4_;
                auVar51._8_4_ = fVar30 * auVar41._8_4_;
                auVar51._12_4_ = fVar32 * auVar41._12_4_;
                auVar41 = vsubps_avx(auVar53,auVar20);
                auVar54._0_4_ = fVar34 * auVar41._0_4_;
                auVar54._4_4_ = fVar38 * auVar41._4_4_;
                auVar54._8_4_ = fVar39 * auVar41._8_4_;
                auVar54._12_4_ = fVar40 * auVar41._12_4_;
                auVar41 = vsubps_avx(auVar56,auVar62);
                auVar57._0_4_ = fVar16 * auVar41._0_4_;
                auVar57._4_4_ = fVar17 * auVar41._4_4_;
                auVar57._8_4_ = fVar18 * auVar41._8_4_;
                auVar57._12_4_ = fVar19 * auVar41._12_4_;
                auVar41 = vpminsd_avx(auVar58,auVar51);
                auVar35 = vpminsd_avx(auVar43,auVar54);
                auVar41 = vpmaxsd_avx(auVar41,auVar35);
                auVar35 = vpminsd_avx(auVar47,auVar57);
                auVar41 = vpmaxsd_avx(auVar41,auVar35);
                auVar35 = vpmaxsd_avx(auVar58,auVar51);
                auVar36 = vpmaxsd_avx(auVar43,auVar54);
                auVar36 = vpminsd_avx(auVar35,auVar36);
                auVar35 = vpmaxsd_avx(auVar47,auVar57);
                auVar35 = vpminsd_avx(auVar35,auVar22);
                auVar36 = vpminsd_avx(auVar36,auVar35);
                auVar35 = vpmaxsd_avx(auVar41,(undefined1  [16])aVar6);
                if ((uVar10 & 7) == 6) {
                  auVar35 = vcmpps_avx(auVar35,auVar36,2);
                  uVar3 = *(undefined4 *)(uVar8 + 0xe0 + uVar9 * 4);
                  auVar48._4_4_ = uVar3;
                  auVar48._0_4_ = uVar3;
                  auVar48._8_4_ = uVar3;
                  auVar48._12_4_ = uVar3;
                  auVar36 = vcmpps_avx(auVar48,auVar27,2);
                  uVar3 = *(undefined4 *)(uVar8 + 0xf0 + uVar9 * 4);
                  auVar52._4_4_ = uVar3;
                  auVar52._0_4_ = uVar3;
                  auVar52._8_4_ = uVar3;
                  auVar52._12_4_ = uVar3;
                  auVar27 = vcmpps_avx(auVar27,auVar52,1);
                  auVar27 = vandps_avx(auVar36,auVar27);
                  auVar27 = vandps_avx(auVar27,auVar35);
                }
                else {
                  auVar27 = vcmpps_avx(auVar35,auVar36,2);
                }
                auVar35 = vcmpps_avx(auVar22,(undefined1  [16])local_17c8,6);
                auVar27 = vandps_avx(auVar27,auVar35);
                auVar27 = vpslld_avx(auVar27,0x1f);
                if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar27[0xf] < '\0') {
                  auVar44._8_4_ = 0x7f800000;
                  auVar44._0_8_ = 0x7f8000007f800000;
                  auVar44._12_4_ = 0x7f800000;
                  auVar27 = vblendvps_avx(auVar44,auVar41,auVar27);
                  if (sVar11 != 8) {
                    pNVar13->ptr = sVar11;
                    pNVar13 = pNVar13 + 1;
                    *paVar12 = auVar23._0_16_;
                    paVar12 = paVar12 + 1;
                  }
                  auVar23 = ZEXT1664(auVar27);
                  sVar11 = sVar4;
                }
              }
            } while ((sVar4 != 8) && (bVar14 = uVar9 < 3, uVar9 = uVar9 + 1, bVar14));
            local_17c8 = auVar23._0_16_;
          } while (sVar11 != 8);
        }
        bVar15 = false;
      }
      goto LAB_00336976;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar15 = uVar9 - 8 <= uVar8;
    uVar8 = uVar8 + 1;
    valid0.field_0 = aVar5;
    if (bVar15) break;
LAB_003369e6:
    InstanceArrayIntersectorKMB<4>::occluded(local_16e8,&valid0,&pre,ray,context,prim);
    aVar5.v = (__m128)vandnps_avx((undefined1  [16])local_16e8,valid0.field_0);
    auVar27 = (undefined1  [16])valid0.field_0 & ~(undefined1  [16])local_16e8;
    aVar21 = valid0.field_0;
    if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar27[0xf])
    break;
  }
LAB_00336a3a:
  valid0.field_0 = aVar5;
  auVar27 = vpcmpeqd_avx((undefined1  [16])aVar21,(undefined1  [16])aVar21);
  local_17a8 = vpor_avx(local_17a8,auVar27 ^ (undefined1  [16])valid0.field_0);
  auVar27 = auVar27 & ~local_17a8;
  if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar27[0xf]) {
    auVar60 = ZEXT1664(auVar26);
    auVar61 = ZEXT1664(auVar20);
    auVar63 = ZEXT1664(auVar62);
    auVar59 = ZEXT1664(auVar22);
    bVar15 = true;
  }
  else {
    auVar27._8_4_ = 0xff800000;
    auVar27._0_8_ = 0xff800000ff800000;
    auVar27._12_4_ = 0xff800000;
    auVar22 = vblendvps_avx(auVar22,auVar27,local_17a8);
    auVar59 = ZEXT1664(auVar22);
    bVar15 = false;
    auVar60 = ZEXT1664(auVar26);
    auVar61 = ZEXT1664(auVar20);
    auVar63 = ZEXT1664(auVar62);
  }
LAB_00336976:
  if (bVar15) {
    auVar7 = vandps_avx(auVar7,local_17a8);
    auVar22._8_4_ = 0xff800000;
    auVar22._0_8_ = 0xff800000ff800000;
    auVar22._12_4_ = 0xff800000;
    auVar7 = vmaskmovps_avx(auVar7,auVar22);
    *(undefined1 (*) [16])(ray + 0x80) = auVar7;
    return;
  }
  goto LAB_00336735;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }